

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_gt.cpp
# Opt level: O0

void __thiscall TFIEnergy_ChainF1_Test::TestBody(TFIEnergy_ChainF1_Test *this)

{
  undefined1 uVar1;
  AssertHelper *this_00;
  float J_00;
  Message *in_stack_00000028;
  AssertHelper *in_stack_00000030;
  AssertionResult gtest_ar;
  float ene;
  float Gamma;
  float J;
  float in_stack_00000318;
  float in_stack_0000031c;
  char *in_stack_00000320;
  char *in_stack_00000328;
  undefined7 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffec;
  
  convert<float>((char *)in_stack_ffffffffffffffe0._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  J_00 = convert<float>((char *)in_stack_ffffffffffffffe0._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
  tfi::energy::chain::infinite<float>(J_00,in_stack_ffffffffffffffec);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_00000328,in_stack_00000320,in_stack_0000031c,in_stack_00000318);
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffd8);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10d3c7)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffb0));
    testing::internal::AssertHelper::operator=(in_stack_00000030,in_stack_00000028);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10d415);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d455);
  return;
}

Assistant:

TEST(TFIEnergy, ChainF1) {
  typedef float real_t;
  auto J = convert<real_t>("1.2");
  auto Gamma = convert<real_t>("-0.8");
  auto ene = chain::infinite(J, Gamma);
  EXPECT_FLOAT_EQ(-1.3375409772289557122297861376619311247381065311346132244923834297492659680725295510811206803209285916, ene);
}